

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O3

int __thiscall
soplex::SPxHarrisRT<double>::selectLeave
          (SPxHarrisRT<double> *this,double *val,double param_2,bool param_3)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  long lVar5;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  long lVar6;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined7 in_register_00000011;
  long lVar7;
  ulong uVar8;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  ulong extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  double dVar11;
  Real RVar12;
  int local_d4;
  double max;
  double local_c8;
  undefined8 uStack_c0;
  double *local_b8;
  double maxabs;
  double local_a8;
  ulong uStack_a0;
  double local_98;
  ulong uStack_90;
  Real local_88;
  ulong uStack_80;
  long local_70;
  double local_68;
  ulong uStack_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  double local_38;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_06;
  
  maxabs = 1.0;
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])
                    (this,val,CONCAT71(in_register_00000011,param_3));
  local_88 = Tolerances::epsilon(*(Tolerances **)(CONCAT44(extraout_var,iVar3) + 0x1b8));
  uStack_80 = extraout_XMM0_Qb;
  local_68 = degenerateEps(this);
  uStack_60 = extraout_XMM0_Qb_00;
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar1 = *(long *)(CONCAT44(extraout_var_00,iVar3) + 0x6a8);
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  plVar2 = *(long **)(CONCAT44(extraout_var_01,iVar3) + 0x6a8);
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar4 = CONCAT44(extraout_var_02,iVar3);
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  lVar5 = CONCAT44(extraout_var_03,iVar3);
  max = *val;
  local_c8 = max;
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  local_38 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar3) + 0x368))
                               ((long *)CONCAT44(extraout_var_04,iVar3));
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  SSVectorBase<double>::setup
            ((SSVectorBase<double> *)(*(long *)(CONCAT44(extraout_var_05,iVar3) + 0x6a8) + 0x20));
  local_b8 = val;
  local_70 = lVar5;
  if (local_c8 <= local_88) {
    if (-local_88 <= local_c8) {
      return -1;
    }
    minDelta(this,&maxabs,&max,*(int *)(lVar1 + 0x28),*(int **)(lVar1 + 0x30),
             *(double **)(lVar1 + 0x40),(double *)*plVar2,*(double **)(lVar5 + 0x688),
             *(double **)(lVar4 + 0x670));
    if ((max == *local_b8) && (!NAN(max) && !NAN(*local_b8))) {
      return -1;
    }
    ::soplex::infinity::__tls_init();
    local_c8 = *(double *)(in_FS_OFFSET + -8);
    uStack_c0 = 0;
    if (0 < (long)*(int *)(lVar1 + 0x28)) {
      dVar10 = maxabs * local_88 * 0.001;
      local_48 = local_88;
      if (local_88 <= dVar10) {
        local_48 = dVar10;
      }
      uStack_40 = uStack_80;
      dVar10 = -local_48;
      uStack_90 = uStack_80 ^ 0x8000000000000000;
      local_58 = -local_68;
      uStack_50 = uStack_60 ^ 0x8000000000000000;
      uVar8 = (long)*(int *)(lVar1 + 0x28) + 1;
      local_d4 = -1;
      local_a8 = 0.0;
      RVar12 = local_88;
      local_98 = dVar10;
      do {
        lVar5 = *(long *)(lVar1 + 0x30);
        iVar3 = *(int *)(lVar5 + -8 + uVar8 * 4);
        lVar7 = (long)iVar3;
        dVar9 = *(double *)(*(long *)(lVar1 + 0x40) + lVar7 * 8);
        if (dVar10 <= dVar9) {
          if (dVar9 <= local_48) {
            *(undefined8 *)(*(long *)(lVar1 + 0x40) + lVar7 * 8) = 0;
            iVar3 = *(int *)(lVar1 + 0x28);
            *(int *)(lVar1 + 0x28) = iVar3 + -1;
            *(undefined4 *)(lVar5 + -8 + uVar8 * 4) = *(undefined4 *)(lVar5 + -4 + (long)iVar3 * 4);
          }
          else {
            dVar11 = *(double *)(*(long *)(local_70 + 0x688) + lVar7 * 8) -
                     *(double *)(*plVar2 + lVar7 * 8);
            if (local_68 < dVar11) {
              iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
              lVar6 = CONCAT44(extraout_var_09,iVar3);
              dVar10 = *(double *)(*plVar2 + lVar7 * 8);
              lVar5 = *(long *)(lVar6 + 0x688);
              dVar9 = *(double *)(lVar5 + lVar7 * 8);
              dVar11 = (double)-(ulong)(dVar10 < dVar9);
              dVar9 = dVar9 - dVar10;
              goto LAB_002119bc;
            }
            dVar11 = dVar11 / dVar9;
            if ((max <= dVar11) && (dVar11 < RVar12 + local_c8)) goto LAB_00211a37;
          }
        }
        else {
          dVar11 = *(double *)(*(long *)(lVar4 + 0x670) + lVar7 * 8) -
                   *(double *)(*plVar2 + lVar7 * 8);
          if (local_58 <= dVar11) {
            dVar11 = dVar11 / dVar9;
            if ((max <= dVar11) && (dVar11 < RVar12 + local_c8)) {
              dVar9 = -dVar9;
LAB_00211a37:
              if (local_a8 < dVar9) {
                uStack_c0 = 0;
                local_d4 = iVar3;
                local_c8 = dVar11;
                local_a8 = dVar9;
              }
            }
          }
          else {
            iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
            lVar6 = CONCAT44(extraout_var_08,iVar3);
            dVar10 = *(double *)(*plVar2 + lVar7 * 8);
            lVar5 = *(long *)(lVar6 + 0x670);
            dVar9 = *(double *)(lVar5 + lVar7 * 8);
            dVar11 = dVar10 - dVar9;
            dVar9 = (double)-(ulong)(dVar9 < dVar10);
LAB_002119bc:
            *(double *)(lVar6 + 0x380) =
                 (double)((ulong)dVar9 & (ulong)dVar11) + *(double *)(lVar6 + 0x380);
            *(double *)(lVar5 + lVar7 * 8) = dVar10;
            RVar12 = local_88;
            dVar10 = local_98;
          }
        }
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
      goto LAB_00211a66;
    }
  }
  else {
    maxDelta(this,&maxabs,&max,*(int *)(lVar1 + 0x28),*(int **)(lVar1 + 0x30),
             *(double **)(lVar1 + 0x40),(double *)*plVar2,*(double **)(lVar5 + 0x688),
             *(double **)(lVar4 + 0x670));
    if ((max == *local_b8) && (!NAN(max) && !NAN(*local_b8))) {
      return -1;
    }
    ::soplex::infinity::__tls_init();
    local_c8 = -*(double *)(in_FS_OFFSET + -8);
    uStack_c0 = 0x8000000000000000;
    if (0 < (long)*(int *)(lVar1 + 0x28)) {
      dVar9 = maxabs * local_88 * 0.001;
      dVar10 = local_88;
      if (local_88 <= dVar9) {
        dVar10 = dVar9;
      }
      local_58 = -dVar10;
      uStack_50 = uStack_80 ^ 0x8000000000000000;
      local_48 = -local_68;
      uStack_40 = uStack_60 ^ 0x8000000000000000;
      uVar8 = (long)*(int *)(lVar1 + 0x28) + 1;
      local_d4 = -1;
      local_98 = 0.0;
      uStack_a0 = uStack_80;
      RVar12 = local_88;
      local_a8 = dVar10;
      do {
        lVar5 = *(long *)(lVar1 + 0x30);
        iVar3 = *(int *)(lVar5 + -8 + uVar8 * 4);
        lVar7 = (long)iVar3;
        dVar9 = *(double *)(*(long *)(lVar1 + 0x40) + lVar7 * 8);
        if (dVar9 <= dVar10) {
          if (local_58 <= dVar9) {
            *(undefined8 *)(*(long *)(lVar1 + 0x40) + lVar7 * 8) = 0;
            iVar3 = *(int *)(lVar1 + 0x28);
            *(int *)(lVar1 + 0x28) = iVar3 + -1;
            *(undefined4 *)(lVar5 + -8 + uVar8 * 4) = *(undefined4 *)(lVar5 + -4 + (long)iVar3 * 4);
          }
          else {
            dVar11 = *(double *)(*(long *)(local_70 + 0x688) + lVar7 * 8) -
                     *(double *)(*plVar2 + lVar7 * 8);
            if (local_68 < dVar11) {
              iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
              lVar6 = CONCAT44(extraout_var_07,iVar3);
              dVar10 = *(double *)(*plVar2 + lVar7 * 8);
              lVar5 = *(long *)(lVar6 + 0x688);
              dVar9 = *(double *)(lVar5 + lVar7 * 8);
              dVar11 = (double)-(ulong)(dVar10 < dVar9);
              dVar9 = dVar9 - dVar10;
              goto LAB_00211719;
            }
            dVar11 = dVar11 / dVar9;
            if ((dVar11 <= max) && (local_c8 - RVar12 < dVar11)) {
              dVar9 = -dVar9;
              goto LAB_0021179f;
            }
          }
        }
        else {
          dVar11 = *(double *)(*(long *)(lVar4 + 0x670) + lVar7 * 8) -
                   *(double *)(*plVar2 + lVar7 * 8);
          if (local_48 <= dVar11) {
            dVar11 = dVar11 / dVar9;
            if ((dVar11 <= max) && (local_c8 - RVar12 < dVar11)) {
LAB_0021179f:
              if (local_98 < dVar9) {
                uStack_c0 = 0;
                local_d4 = iVar3;
                local_c8 = dVar11;
                local_98 = dVar9;
              }
            }
          }
          else {
            iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
            lVar6 = CONCAT44(extraout_var_06,iVar3);
            dVar10 = *(double *)(*plVar2 + lVar7 * 8);
            lVar5 = *(long *)(lVar6 + 0x670);
            dVar9 = *(double *)(lVar5 + lVar7 * 8);
            dVar11 = dVar10 - dVar9;
            dVar9 = (double)-(ulong)(dVar9 < dVar10);
LAB_00211719:
            *(double *)(lVar6 + 0x380) =
                 (double)((ulong)dVar9 & (ulong)dVar11) + *(double *)(lVar6 + 0x380);
            *(double *)(lVar5 + lVar7 * 8) = dVar10;
            RVar12 = local_88;
            dVar10 = local_a8;
          }
        }
        uVar8 = uVar8 - 1;
      } while (1 < uVar8);
      goto LAB_00211a66;
    }
  }
  local_d4 = -1;
LAB_00211a66:
  iVar3 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])(this);
  dVar10 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar3) + 0x368))
                             ((long *)CONCAT44(extraout_var_10,iVar3));
  if ((local_38 != dVar10) || (NAN(local_38) || NAN(dVar10))) {
    local_d4 = (*(this->super_SPxRatioTester<double>)._vptr_SPxRatioTester[7])(0,this,local_b8,0);
  }
  else {
    *local_b8 = local_c8;
  }
  return local_d4;
}

Assistant:

int SPxHarrisRT<R>::selectLeave(R& val, R, bool)
{
   int i, j;
   R stab, x, y;
   R max;
   R sel;
   R lastshift;
   R useeps;
   int leave = -1;
   R maxabs = 1;

   R epsilon  = this->solver()->epsilon();
   R degeneps = degenerateEps();

   SSVectorBase<R>& upd = this->solver()->fVec().delta();
   VectorBase<R>& vec = this->solver()->fVec();

   const VectorBase<R>& up = this->solver()->ubBound();
   const VectorBase<R>& low = this->solver()->lbBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   max = val;
   lastshift = this->solver()->shift();

   this->solver()->fVec().delta().setup();

   if(max > epsilon)
   {
      // phase 1:
      maxDelta(
         &maxabs,             /* max abs value in upd */
         &max,                /* initial and chosen value */
         upd.size(),          /* # of indices in upd */
         upd.indexMem(),      /* nonzero indices in upd */
         upd.values(),        /* update VectorBase<R> for vec */
         vec.get_const_ptr(),         /* current VectorBase<R> */
         low.get_const_ptr(),                 /* lower bounds for vec */
         up.get_const_ptr()                   /* upper bounds for vec */
      );

      if(max == val)
         return -1;


      // phase 2:
      stab = 0;
      sel = R(-infinity);
      useeps = maxabs * epsilon * 0.001;

      if(useeps < epsilon)
         useeps = epsilon;

      for(j = upd.size() - 1; j >= 0; --j)
      {
         i = upd.index(j);
         x = upd[i];

         if(x > useeps)
         {
            y = up[i] - vec[i];

            if(y < -degeneps)
               this->solver()->shiftUBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y <= max && y > sel - epsilon && x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = x;
               }
            }
         }
         else if(x < -useeps)
         {
            y = low[i] - vec[i];

            if(y > degeneps)
               this->solver()->shiftLBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y <= max && y > sel - epsilon && -x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = -x;
               }
            }
         }
         else
            upd.clearNum(j);
      }
   }


   else if(max < -epsilon)
   {
      // phase 1:
      minDelta(
         &maxabs,             /* max abs value in upd */
         &max,                /* initial and chosen value */
         upd.size(),          /* # of indices in upd */
         upd.indexMem(),      /* nonzero indices in upd */
         upd.values(),        /* update VectorBase<R> for vec */
         vec.get_const_ptr(),                 /* current VectorBase<R> */
         low.get_const_ptr(),                 /* lower bounds for vec */
         up.get_const_ptr()                   /* upper bounds for vec */
      );

      if(max == val)
         return -1;

      // phase 2:
      stab = 0;
      sel = R(infinity);
      useeps = maxabs * epsilon * 0.001;

      if(useeps < epsilon)
         useeps = epsilon;

      for(j = upd.size() - 1; j >= 0; --j)
      {
         i = upd.index(j);
         x = upd[i];

         if(x < -useeps)
         {
            y = up[i] - vec[i];

            if(y < -degeneps)
               this->solver()->shiftUBbound(i, vec[i]);   // ensure simplex improvement
            else
            {
               y /= x;

               if(y >= max && y < sel + epsilon && -x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = -x;
               }
            }
         }
         else if(x > useeps)
         {
            y = low[i] - vec[i];

            if(y > degeneps)
               this->solver()->shiftLBbound(i, vec[i]); // ensure simplex improvement
            else
            {
               y /= x;

               if(y >= max && y < sel + epsilon && x > stab)
               {
                  sel = y;
                  leave = i;
                  stab = x;
               }
            }
         }
         else
            upd.clearNum(j);
      }
   }

   else
      return -1;


   if(lastshift != this->solver()->shift())
      return selectLeave(val, 0, false);

   assert(leave >= 0);

   val = sel;
   return leave;
}